

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O2

CharTrie * __thiscall UnifiedRegex::CharTrie::Add(CharTrie *this,ArenaAllocator *allocator,Char c)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  CharTrieEntry *pCVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int local_2c [2];
  int i;
  
  bVar5 = Find(this,c,local_2c);
  if (!bVar5) {
    iVar3 = this->capacity;
    iVar8 = this->count;
    if (iVar3 <= iVar8) {
      uVar11 = 4;
      if (4 < iVar3 * 2) {
        uVar11 = (ulong)(uint)(iVar3 * 2);
      }
      pCVar6 = (CharTrieEntry *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Realloc
                         (&allocator->
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                          this->children,(long)iVar3 << 5,uVar11 << 5);
      this->children = pCVar6;
      this->capacity = (int)uVar11;
      iVar8 = this->count;
    }
    lVar7 = (long)local_2c[0];
    lVar9 = (long)iVar8;
    lVar10 = lVar9 << 5;
    for (; pCVar6 = this->children, lVar7 < lVar9; lVar9 = lVar9 + -1) {
      *(undefined2 *)((long)&pCVar6->c + lVar10) = *(undefined2 *)((long)&pCVar6[-1].c + lVar10);
      puVar1 = (undefined8 *)((long)pCVar6 + lVar10 + -0x18);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pCVar6->node).children + lVar10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      *(undefined4 *)((long)&(pCVar6->node).count + lVar10) =
           *(undefined4 *)((long)pCVar6 + lVar10 + -8);
      lVar10 = lVar10 + -0x20;
    }
    pCVar6[lVar7].c = c;
    pCVar6[lVar7].node.isAccepting = false;
    pCVar6[lVar7].node.capacity = 0;
    pCVar6[lVar7].node.count = 0;
    pCVar6[lVar7].node.children = (CharTrieEntry *)0x0;
    this->count = this->count + 1;
  }
  return &this->children[local_2c[0]].node;
}

Assistant:

CharTrie* CharTrie::Add(ArenaAllocator* allocator, Char c)
    {
        int i;
        if (!Find(c, i))
        {
            if (capacity <= count)
            {
                int newCapacity = max(capacity * 2, initCapacity);
                children = (CharTrieEntry*)allocator->Realloc(children, capacity * sizeof(CharTrieEntry), newCapacity * sizeof(CharTrieEntry));
                capacity = newCapacity;
            }

            for (int j = count; j > i; j--)
            {
                children[j].c = children[j - 1].c;
                children[j].node = children[j - 1].node;
            }
            children[i].c = c;
            children[i].node.Reset();
            count++;
        }
        return &children[i].node;
    }